

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void biflen(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  ushort *puVar2;
  uint uVar3;
  runsdef *prVar4;
  int iVar5;
  runcxdef *prVar6;
  anon_union_8_4_1dda36f5_for_runsv aVar7;
  ushort *puVar8;
  runsdef val;
  
  prVar6 = ctx->bifcxrun;
  uVar1 = prVar6->runcxsp[-1].runstyp;
  prVar4 = prVar6->runcxsp + -1;
  if (uVar1 == '\a') {
    prVar6->runcxsp = prVar4;
    if (prVar4->runstyp != '\a') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3fc);
    }
    puVar2 = (ushort *)(ctx->bifcxrun->runcxsp->runsv).runsvstr;
    puVar8 = puVar2 + 1;
    aVar7.runsvnum = 0;
    for (iVar5 = *puVar2 - 2; iVar5 != 0; iVar5 = iVar5 - (uVar3 + 1)) {
      uVar3 = datsiz((uint)(byte)*puVar8,(byte *)((long)puVar8 + 1));
      puVar8 = (ushort *)((long)puVar8 + (long)(int)(uVar3 + 1));
      aVar7.runsvstr = (uchar *)(aVar7.runsvnum + 1);
    }
    prVar6 = ctx->bifcxrun;
  }
  else {
    if (uVar1 != '\x03') {
      prVar6->runcxerr->errcxptr->erraav[0].errastr = "length";
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
      runsign(ctx->bifcxrun,0x3ff);
    }
    prVar6->runcxsp = prVar4;
    prVar6 = ctx->bifcxrun;
    if (prVar4->runstyp != '\x03') {
      prVar6->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3ef);
    }
    aVar7.runsvstr = (uchar *)((ulong)*(ushort *)(prVar6->runcxsp->runsv).runsvstr - 2);
  }
  val.runsv = aVar7;
  runpush(prVar6,1,&val);
  return;
}

Assistant:

void biflen(bifcxdef *ctx, int argc)
{
    uchar   *p;
    runsdef  val;
    long     len;
    int      l;
    
    bifcntargs(ctx, 1, argc);
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_SSTRING:
        p = (uchar *)runpopstr(ctx->bifcxrun);
        len = osrp2(p) - 2;
        break;

    case DAT_LIST:
        p = runpoplst(ctx->bifcxrun);
        l = osrp2(p) - 2;
        p += 2;
        
        /* count all elements in list */
        for (len = 0 ; l ; ++len)
        {
            int cursiz;
            
            /* get size of this element, and move past it */
            cursiz = datsiz(*p, p+1) + 1;
            l -= cursiz;
            p += cursiz;
        }
        break;

    default:
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "length");
    }
    
    val.runsv.runsvnum = len;
    runpush(ctx->bifcxrun, DAT_NUMBER, &val);
}